

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Section::~Section(Section *this)

{
  bool bVar1;
  IResultCapture *pIVar2;
  long lStack_60;
  SectionEndInfo endInfo;
  
  if (this->m_sectionIncluded == true) {
    SectionInfo::SectionInfo(&endInfo.sectionInfo,&this->m_info);
    endInfo.prevAssertions.failedButOk = (this->m_assertions).failedButOk;
    endInfo.prevAssertions.passed = (this->m_assertions).passed;
    endInfo.prevAssertions.failed = (this->m_assertions).failed;
    endInfo.durationInSeconds = Timer::getElapsedSeconds(&this->m_timer);
    bVar1 = uncaught_exceptions();
    if (bVar1) {
      pIVar2 = getResultCapture();
      lStack_60 = 0x20;
    }
    else {
      pIVar2 = getResultCapture();
      lStack_60 = 0x18;
    }
    (**(code **)((long)pIVar2->_vptr_IResultCapture + lStack_60))(pIVar2,&endInfo);
    std::__cxx11::string::~string((string *)&endInfo);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Section::~Section() {
        if (m_sectionIncluded) {
            SectionEndInfo endInfo{ m_info, m_assertions, m_timer.getElapsedSeconds() };
            if (uncaught_exceptions())
                getResultCapture().sectionEndedEarly(endInfo);
            else
                getResultCapture().sectionEnded(endInfo);
        }
    }